

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O0

DdNode * extraZddTuplesFromBdd(DdManager *dd,DdNode *bVarsK,DdNode *bVarsN)

{
  DdNode *n;
  DdHalfWord local_4c;
  DdHalfWord local_44;
  DdNode *local_40;
  DdNode *zRes1;
  DdNode *zRes0;
  DdNode *zRes;
  DdNode *bVarsN_local;
  DdNode *bVarsK_local;
  DdManager *dd_local;
  
  if (bVarsK->index == 0x7fffffff) {
    local_44 = bVarsK->index;
  }
  else {
    local_44 = dd->perm[bVarsK->index];
  }
  if (bVarsN->index == 0x7fffffff) {
    local_4c = bVarsN->index;
  }
  else {
    local_4c = dd->perm[bVarsN->index];
  }
  if ((int)local_44 < (int)local_4c) {
    dd_local = (DdManager *)dd->zero;
  }
  else if (bVarsN == dd->one) {
    dd_local = (DdManager *)dd->one;
  }
  else {
    dd_local = (DdManager *)cuddCacheLookup2Zdd(dd,extraZddTuplesFromBdd,bVarsK,bVarsN);
    if (dd_local == (DdManager *)0x0) {
      n = extraZddTuplesFromBdd(dd,bVarsK,(bVarsN->type).kids.T);
      if (n == (DdNode *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) + 1;
        if (bVarsK == dd->one) {
          local_40 = dd->zero;
          *(int *)(((ulong)local_40 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)local_40 & 0xfffffffffffffffe) + 4) + 1;
        }
        else {
          local_40 = extraZddTuplesFromBdd(dd,(bVarsK->type).kids.T,(bVarsN->type).kids.T);
          if (local_40 == (DdNode *)0x0) {
            Cudd_RecursiveDerefZdd(dd,n);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)local_40 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)local_40 & 0xfffffffffffffffe) + 4) + 1;
        }
        dd_local = (DdManager *)cuddZddGetNode(dd,bVarsN->index << 1,local_40,n);
        if (dd_local == (DdManager *)0x0) {
          Cudd_RecursiveDerefZdd(dd,n);
          Cudd_RecursiveDerefZdd(dd,local_40);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) + -1;
          *(int *)(((ulong)local_40 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)local_40 & 0xfffffffffffffffe) + 4) + -1;
          cuddCacheInsert2(dd,extraZddTuplesFromBdd,bVarsK,bVarsN,(DdNode *)dd_local);
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode* extraZddTuplesFromBdd( 
  DdManager * dd,   /* the DD manager */
  DdNode * bVarsK,   /* the number of variables in tuples */
  DdNode * bVarsN)   /* the set of all variables */
{
    DdNode *zRes, *zRes0, *zRes1;
    statLine(dd); 

    /* terminal cases */
/*  if ( k < 0 || k > n )
 *      return dd->zero;
 *  if ( n == 0 )
 *      return dd->one; 
 */
    if ( cuddI( dd, bVarsK->index ) < cuddI( dd, bVarsN->index ) )
        return z0;
    if ( bVarsN == b1 )
        return z1;

    /* check cache */
    zRes = cuddCacheLookup2Zdd(dd, extraZddTuplesFromBdd, bVarsK, bVarsN);
    if (zRes)
        return(zRes);

    /* ZDD in which this variable is 0 */
/*  zRes0 = extraZddTuplesFromBdd( dd, k,     n-1 ); */
    zRes0 = extraZddTuplesFromBdd( dd, bVarsK, cuddT(bVarsN) );
    if ( zRes0 == NULL ) 
        return NULL;
    cuddRef( zRes0 );

    /* ZDD in which this variable is 1 */
/*  zRes1 = extraZddTuplesFromBdd( dd, k-1,          n-1 ); */
    if ( bVarsK == b1 )
    {
        zRes1 = z0;
        cuddRef( zRes1 );
    }
    else
    {
        zRes1 = extraZddTuplesFromBdd( dd, cuddT(bVarsK), cuddT(bVarsN) );
        if ( zRes1 == NULL ) 
        {
            Cudd_RecursiveDerefZdd( dd, zRes0 );
            return NULL;
        }
        cuddRef( zRes1 );
    }

    /* compose Res0 and Res1 with the given ZDD variable */
    zRes = cuddZddGetNode( dd, 2*bVarsN->index, zRes1, zRes0 );
    if ( zRes == NULL ) 
    {
        Cudd_RecursiveDerefZdd( dd, zRes0 );
        Cudd_RecursiveDerefZdd( dd, zRes1 );
        return NULL;
    }
    cuddDeref( zRes0 );
    cuddDeref( zRes1 );

    /* insert the result into cache */
    cuddCacheInsert2(dd, extraZddTuplesFromBdd, bVarsK, bVarsN, zRes);
    return zRes;

}